

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retDelay.c
# Opt level: O1

int Abc_NtkRetimeMinDelayTry
              (Abc_Ntk_t *pNtk,int nDelayLim,int fForward,int fInitial,int nIterLimit,int *pIterBest
              ,int fVerbose)

{
  undefined4 uVar1;
  uint uVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  Abc_Obj_t *pObj;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint *__ptr;
  void *pvVar10;
  ulong uVar11;
  int *piVar12;
  uint *__ptr_00;
  Vec_Ptr_t *pVVar13;
  char *pcVar14;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar15;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  uint local_9c;
  uint local_98;
  uint local_8c;
  Vec_Int_t *local_88;
  int local_74;
  Abc_Ntk_t *local_68;
  
  if (fInitial != 0) {
    if (fForward == 0) {
      local_88 = Abc_NtkRetimeCollectLatchValues(pNtk);
      local_68 = Abc_NtkRetimeBackwardInitialStart(pNtk);
      goto LAB_008d8ba6;
    }
    Abc_NtkRetimeTranferToCopy(pNtk);
  }
  local_88 = (Vec_Int_t *)0x0;
  local_68 = (Abc_Ntk_t *)0x0;
LAB_008d8ba6:
  bVar21 = fInitial == 0;
  bVar22 = fVerbose != 0;
  if (bVar22 && bVar21) {
    puts("Performing analysis:");
  }
  local_74 = pNtk->nObjCounts[8];
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar10 = malloc(800);
  pcVar14 = "Fwd";
  if (fForward == 0) {
    pcVar14 = "Bwd";
  }
  *(void **)(__ptr + 2) = pvVar10;
  local_8c = 0xffffffff;
  local_98 = 1000000000;
  uVar11 = 0;
  local_9c = 0;
  while( true ) {
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar9 = pNtk->vObjs->nSize;
      uVar19 = (long)iVar9 + 500;
      iVar16 = (int)uVar19;
      if ((pNtk->vTravIds).nCap < iVar16) {
        piVar12 = (int *)malloc(uVar19 * 4);
        (pNtk->vTravIds).pArray = piVar12;
        if (piVar12 == (int *)0x0) goto LAB_008d9601;
        (pNtk->vTravIds).nCap = iVar16;
      }
      if (-500 < iVar9) {
        memset((pNtk->vTravIds).pArray,0,(uVar19 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar16;
    }
    iVar9 = pNtk->nTravIds;
    pNtk->nTravIds = iVar9 + 1;
    if (0x3ffffffe < iVar9) break;
    uVar8 = pNtk->nObjCounts[8];
    __ptr_00 = (uint *)malloc(0x10);
    if (uVar8 - 1 < 7) {
      uVar8 = 8;
    }
    __ptr_00[1] = 0;
    *__ptr_00 = uVar8;
    if (uVar8 == 0) {
      pvVar10 = (void *)0x0;
    }
    else {
      pvVar10 = malloc((long)(int)uVar8 << 3);
    }
    *(void **)(__ptr_00 + 2) = pvVar10;
    pVVar13 = pNtk->vObjs;
    if (0 < pVVar13->nSize) {
      lVar17 = 0;
      do {
        plVar3 = (long *)pVVar13->pArray[lVar17];
        if (plVar3 != (long *)0x0) {
          if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
            uVar8 = __ptr_00[1];
            uVar7 = *__ptr_00;
            if (uVar8 == uVar7) {
              if ((int)uVar7 < 0x10) {
                if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                  pvVar10 = malloc(0x80);
                }
                else {
                  pvVar10 = realloc(*(void **)(__ptr_00 + 2),0x80);
                }
                uVar6 = 0x10;
              }
              else {
                uVar6 = uVar7 * 2;
                if ((int)uVar6 <= (int)uVar7) goto LAB_008d8da6;
                if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                  pvVar10 = malloc((ulong)uVar7 << 4);
                }
                else {
                  pvVar10 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar7 << 4);
                }
              }
              *(void **)(__ptr_00 + 2) = pvVar10;
              *__ptr_00 = uVar6;
            }
LAB_008d8da6:
            __ptr_00[1] = uVar8 + 1;
            *(long **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar8 * 8) = plVar3;
          }
          if ((*(uint *)((long)plVar3 + 0x14) & 0xf) != 7) {
            *(uint *)((long)plVar3 + 0x14) = *(uint *)((long)plVar3 + 0x14) & 0xfff;
            lVar18 = *plVar3;
            uVar1 = *(undefined4 *)(lVar18 + 0xd8);
            iVar9 = (int)plVar3[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar18 + 0xe0),iVar9 + 1,(int)__ptr_00);
            if (((long)iVar9 < 0) || (*(int *)(lVar18 + 0xe4) <= iVar9)) {
LAB_008d95c3:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(undefined4 *)(*(long *)(lVar18 + 0xe8) + (long)iVar9 * 4) = uVar1;
          }
        }
        lVar17 = lVar17 + 1;
        pVVar13 = pNtk->vObjs;
      } while (lVar17 < pVVar13->nSize);
    }
    uVar8 = __ptr_00[1];
    if (fForward == 0) {
      if ((int)uVar8 < 1) {
        uVar7 = 0;
      }
      else {
        lVar17 = *(long *)(__ptr_00 + 2);
        uVar19 = 0;
        uVar6 = 0;
        do {
          plVar3 = *(long **)(lVar17 + uVar19 * 8);
          uVar7 = Abc_NtkRetimeTiming_rec
                            (*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                              (long)*(int *)plVar3[4] * 8),0);
          if ((int)uVar7 < (int)uVar6) {
            uVar7 = uVar6;
          }
          uVar19 = uVar19 + 1;
          uVar6 = uVar7;
        } while (uVar8 != uVar19);
      }
      pVVar13 = pNtk->vPos;
      if (0 < pVVar13->nSize) {
        lVar17 = 0;
        do {
          uVar8 = Abc_NtkRetimeTiming_rec
                            (*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*pVVar13->pArray[lVar17] + 0x20) + 8) +
                              (long)**(int **)((long)pVVar13->pArray[lVar17] + 0x20) * 8),0);
          if ((int)uVar7 <= (int)uVar8) {
            uVar7 = uVar8;
          }
          lVar17 = lVar17 + 1;
          pVVar13 = pNtk->vPos;
        } while (lVar17 < pVVar13->nSize);
      }
    }
    else {
      if ((int)uVar8 < 1) {
        uVar7 = 0;
      }
      else {
        lVar17 = *(long *)(__ptr_00 + 2);
        uVar19 = 0;
        uVar7 = 0;
        do {
          plVar3 = *(long **)(lVar17 + uVar19 * 8);
          if (0 < *(int *)((long)plVar3 + 0x2c)) {
            lVar18 = 0;
            do {
              uVar6 = Abc_NtkRetimeTiming_rec
                                (*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                  (long)*(int *)(plVar3[6] + lVar18 * 4) * 8),fForward);
              if ((int)uVar7 <= (int)uVar6) {
                uVar7 = uVar6;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < *(int *)((long)plVar3 + 0x2c));
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar8);
      }
      pVVar13 = pNtk->vPis;
      if (0 < pVVar13->nSize) {
        lVar17 = 0;
        do {
          plVar3 = (long *)pVVar13->pArray[lVar17];
          if (0 < *(int *)((long)plVar3 + 0x2c)) {
            lVar18 = 0;
            do {
              uVar8 = Abc_NtkRetimeTiming_rec
                                (*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                  (long)*(int *)(plVar3[6] + lVar18 * 4) * 8),fForward);
              if ((int)uVar7 <= (int)uVar8) {
                uVar7 = uVar8;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < *(int *)((long)plVar3 + 0x2c));
          }
          lVar17 = lVar17 + 1;
          pVVar13 = pNtk->vPis;
        } while (lVar17 < pVVar13->nSize);
      }
    }
    __ptr[1] = 0;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar9 = pNtk->vObjs->nSize;
      uVar19 = (long)iVar9 + 500;
      iVar16 = (int)uVar19;
      if ((pNtk->vTravIds).nCap < iVar16) {
        piVar12 = (int *)malloc(uVar19 * 4);
        (pNtk->vTravIds).pArray = piVar12;
        if (piVar12 == (int *)0x0) {
LAB_008d9601:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar16;
      }
      if (-500 < iVar9) {
        memset((pNtk->vTravIds).pArray,0,(uVar19 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar16;
    }
    iVar9 = pNtk->nTravIds;
    pNtk->nTravIds = iVar9 + 1;
    if (0x3ffffffe < iVar9) break;
    uVar8 = __ptr_00[1];
    if (fForward == 0) {
      if (0 < (int)uVar8) {
        lVar17 = *(long *)(__ptr_00 + 2);
        uVar19 = 0;
        puVar15 = __ptr_00;
        do {
          plVar3 = *(long **)(lVar17 + uVar19 * 8);
          if (0 < *(int *)((long)plVar3 + 0x1c)) {
            lVar18 = 0;
            do {
              plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                 (long)*(int *)(plVar3[4] + lVar18 * 4) * 8);
              lVar5 = *plVar4;
              iVar9 = (int)plVar4[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar9 + 1,(int)puVar15);
              if (((long)iVar9 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar9)) goto LAB_008d95a4;
              puVar15 = extraout_RDX_01;
              if ((*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar9 * 4) != *(int *)(*plVar4 + 0xd8))
                 && (uVar7 == *(uint *)((long)plVar4 + 0x14) >> 0xc)) {
                uVar6 = __ptr[1];
                uVar2 = *__ptr;
                if (uVar6 == uVar2) {
                  if ((int)uVar2 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar10 = malloc(0x80);
                    }
                    else {
                      pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    uVar20 = 0x10;
                  }
                  else {
                    uVar20 = uVar2 * 2;
                    if ((int)uVar20 <= (int)uVar2) goto LAB_008d92ff;
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar10 = malloc((ulong)uVar2 << 4);
                    }
                    else {
                      pvVar10 = realloc(*(void **)(__ptr + 2),(ulong)uVar2 << 4);
                    }
                  }
                  *(void **)(__ptr + 2) = pvVar10;
                  *__ptr = uVar20;
                }
LAB_008d92ff:
                __ptr[1] = uVar6 + 1;
                *(long **)(*(long *)(__ptr + 2) + (long)(int)uVar6 * 8) = plVar4;
                lVar5 = *plVar4;
                uVar1 = *(undefined4 *)(lVar5 + 0xd8);
                iVar9 = (int)plVar4[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar9 + 1,(int)__ptr);
                if (((long)iVar9 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar9)) goto LAB_008d95c3;
                *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar9 * 4) = uVar1;
                puVar15 = extraout_RDX_02;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < *(int *)((long)plVar3 + 0x1c));
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar8);
      }
    }
    else if (0 < (int)uVar8) {
      lVar17 = *(long *)(__ptr_00 + 2);
      uVar19 = 0;
      puVar15 = __ptr_00;
      do {
        plVar3 = *(long **)(lVar17 + uVar19 * 8);
        if (0 < *(int *)((long)plVar3 + 0x2c)) {
          lVar18 = 0;
          do {
            plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[6] + lVar18 * 4) * 8);
            lVar5 = *plVar4;
            iVar9 = (int)plVar4[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar9 + 1,(int)puVar15);
            if (((long)iVar9 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar9)) {
LAB_008d95a4:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            puVar15 = extraout_RDX;
            if ((*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar9 * 4) != *(int *)(*plVar4 + 0xd8)) &&
               (uVar7 == *(uint *)((long)plVar4 + 0x14) >> 0xc)) {
              uVar6 = __ptr[1];
              uVar2 = *__ptr;
              if (uVar6 == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar10 = malloc(0x80);
                  }
                  else {
                    pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
                  }
                  uVar20 = 0x10;
                }
                else {
                  uVar20 = uVar2 * 2;
                  if ((int)uVar20 <= (int)uVar2) goto LAB_008d9170;
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar10 = malloc((ulong)uVar2 << 4);
                  }
                  else {
                    pvVar10 = realloc(*(void **)(__ptr + 2),(ulong)uVar2 << 4);
                  }
                }
                *(void **)(__ptr + 2) = pvVar10;
                *__ptr = uVar20;
              }
LAB_008d9170:
              __ptr[1] = uVar6 + 1;
              *(long **)(*(long *)(__ptr + 2) + (long)(int)uVar6 * 8) = plVar4;
              lVar5 = *plVar4;
              uVar1 = *(undefined4 *)(lVar5 + 0xd8);
              iVar9 = (int)plVar4[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar9 + 1,(int)__ptr);
              if (((long)iVar9 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar9)) goto LAB_008d95c3;
              *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar9 * 4) = uVar1;
              puVar15 = extraout_RDX_00;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < *(int *)((long)plVar3 + 0x2c));
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar8);
    }
    if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
      free(*(void **)(__ptr_00 + 2));
      __ptr_00[2] = 0;
      __ptr_00[3] = 0;
    }
    free(__ptr_00);
    uVar8 = (uint)uVar11;
    if (uVar8 == 0) {
      local_8c = uVar7;
    }
    if (local_98 - uVar7 != 0 && (int)uVar7 <= (int)local_98) {
      if (bVar22 && bVar21) {
        dVar23 = (double)(pNtk->nObjCounts[8] - local_74);
        dVar24 = (double)(int)(local_98 - uVar7);
        printf("%s Iter = %3d. Delay = %3d. Latches = %5d. Delta = %6.2f. Ratio = %4.2f %%\n",
               dVar23 / dVar24,((dVar23 * 100.0) / (double)pNtk->nObjCounts[8]) / dVar24,pcVar14,
               uVar11,(ulong)uVar7);
      }
      local_74 = pNtk->nObjCounts[8];
      local_9c = uVar8;
      local_98 = uVar7;
    }
    if (((uVar8 == nIterLimit) || (0x14 < (int)(uVar8 - local_9c))) ||
       (0 < nDelayLim && (int)uVar7 <= nDelayLim)) {
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      if (fInitial != 0) {
        if (fForward == 0) {
          Abc_NtkRetimeBackwardInitialFinish(pNtk,local_68,local_88,fVerbose);
          Abc_NtkDelete(local_68);
          if (local_88->pArray != (int *)0x0) {
            free(local_88->pArray);
            local_88->pArray = (int *)0x0;
          }
          if (local_88 != (Vec_Int_t *)0x0) {
            free(local_88);
          }
        }
        else {
          Abc_NtkRetimeTranferFromCopy(pNtk);
        }
      }
      if (bVar22 && bVar21) {
        pcVar14 = "Forward ";
        if (fForward == 0) {
          pcVar14 = "Backward";
        }
        printf("%s : Starting delay = %3d.  Final delay = %3d.  IterBest = %2d (out of %2d).\n",
               pcVar14,(ulong)local_8c,(ulong)local_98,(ulong)local_9c,(ulong)(uint)nIterLimit);
      }
      if (nIterLimit == 1) {
        local_9c = 1;
      }
      *pIterBest = local_9c;
      return local_98;
    }
    uVar7 = __ptr[1];
    if (0 < (long)(int)uVar7) {
      lVar17 = *(long *)(__ptr + 2);
      lVar18 = 0;
      do {
        pObj = *(Abc_Obj_t **)(lVar17 + lVar18 * 8);
        iVar9 = Abc_NtkRetimeNodeIsEnabled(pObj,fForward);
        if (iVar9 != 0) {
          Abc_NtkRetimeNode(pObj,fForward,fInitial);
        }
        lVar18 = lVar18 + 1;
      } while ((int)uVar7 != lVar18);
    }
    if (fForward == 0) {
      Abc_NtkRetimeShareLatches(pNtk,fInitial);
    }
    uVar11 = (ulong)(uVar8 + 1);
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkRetimeMinDelayTry( Abc_Ntk_t * pNtk, int nDelayLim, int fForward, int fInitial, int nIterLimit, int * pIterBest, int fVerbose )
{
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vCritical;
    Vec_Int_t * vValues = NULL; // Suppress "might be used uninitialized"
    Abc_Obj_t * pObj;
    int i, k, IterBest, DelayCur, DelayBest;
    int DelayStart = -1; // Suppress "might be used uninitialized"
    int LatchesBest;
    // transfer intitial values
    if ( fInitial )
    {
        if ( fForward )
            Abc_NtkRetimeTranferToCopy( pNtk );
        else
        {
            // save initial value of the latches
            vValues = Abc_NtkRetimeCollectLatchValues( pNtk );
            // start the network for initial value computation
            pNtkNew = Abc_NtkRetimeBackwardInitialStart( pNtk );
        }
    }

    if ( fVerbose && !fInitial )
        printf( "Performing analysis:\n" );
    // find the best iteration
    DelayBest = ABC_INFINITY; IterBest = 0; LatchesBest = Abc_NtkLatchNum(pNtk);
    vCritical = Vec_PtrAlloc( 100 );
    for ( i = 0; ; i++ )
    {
        // perform moves for the timing-critical nodes
        DelayCur = Abc_NtkRetimeTiming( pNtk, fForward, vCritical );
        if ( i == 0 )
            DelayStart = DelayCur;
        // record this position if it has the best delay
        if ( DelayBest > DelayCur )
        {
if ( fVerbose && !fInitial )
    printf( "%s Iter = %3d. Delay = %3d. Latches = %5d. Delta = %6.2f. Ratio = %4.2f %%\n", 
        fForward ? "Fwd": "Bwd", i, DelayCur, Abc_NtkLatchNum(pNtk), 
        1.0*(Abc_NtkLatchNum(pNtk)-LatchesBest)/(DelayBest-DelayCur), 
        100.0*(Abc_NtkLatchNum(pNtk)-LatchesBest)/Abc_NtkLatchNum(pNtk)/(DelayBest-DelayCur) );

            DelayBest = DelayCur;
            IterBest = i;
            LatchesBest = Abc_NtkLatchNum(pNtk);
        }
        // quit after timing analysis
        if ( i == nIterLimit )
            break;
        // skip if 10 iterations did not give improvement
        if ( i - IterBest > 20 )
            break;
        // skip if delay limit is reached
        if ( nDelayLim > 0 && DelayCur <= nDelayLim )
            break;
        // try retiming to improve the delay
        Vec_PtrForEachEntry( Abc_Obj_t *, vCritical, pObj, k )
            if ( Abc_NtkRetimeNodeIsEnabled(pObj, fForward) )
                Abc_NtkRetimeNode( pObj, fForward, fInitial );
        // share latches
        if ( !fForward )
            Abc_NtkRetimeShareLatches( pNtk, fInitial );    
    }
    Vec_PtrFree( vCritical );
    // transfer the initial state back to the latches
    if ( fInitial )
    {
        if ( fForward )
            Abc_NtkRetimeTranferFromCopy( pNtk );
        else
        {
            Abc_NtkRetimeBackwardInitialFinish( pNtk, pNtkNew, vValues, fVerbose );
            Abc_NtkDelete( pNtkNew );
            Vec_IntFree( vValues );
        }
    }
    if ( fVerbose && !fInitial )
        printf( "%s : Starting delay = %3d.  Final delay = %3d.  IterBest = %2d (out of %2d).\n",
            fForward? "Forward " : "Backward", DelayStart, DelayBest, IterBest, nIterLimit );
    *pIterBest = (nIterLimit == 1) ? 1 : IterBest;
    return DelayBest;
}